

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

int ws_frame_op2flags(uchar proto_opcode)

{
  ulong local_18;
  size_t i;
  uchar opcode;
  uchar proto_opcode_local;
  
  local_18 = 0;
  while( true ) {
    if (5 < local_18) {
      return 0;
    }
    if ((int)WS_FRAMES[local_18].proto_opcode == (uint)(proto_opcode & 0xf)) break;
    local_18 = local_18 + 1;
  }
  return WS_FRAMES[local_18].flags;
}

Assistant:

static int ws_frame_op2flags(unsigned char proto_opcode)
{
  unsigned char opcode = proto_opcode & WSBIT_OPCODE_MASK;
  size_t i;
  for(i = 0; i < sizeof(WS_FRAMES)/sizeof(WS_FRAMES[0]); ++i) {
    if(WS_FRAMES[i].proto_opcode == opcode)
      return WS_FRAMES[i].flags;
  }
  return 0;
}